

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

PropertyIdArray *
Js::InterpreterStackFrame::OP_NewPropIdArrForCompProps(uint32 size,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this;
  undefined4 *puVar4;
  PropertyIdArray *pPVar5;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (0x3fffffff < size) {
    ::Math::DefaultOverflowPolicy();
  }
  local_50 = (undefined1  [8])&PropertyIdArray::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4bd2daf;
  data.filename._0_4_ = 0x167c;
  data.typeinfo = (type_info *)(ulong)(size * 4);
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_009a869d;
    *puVar4 = 0;
  }
  pPVar5 = (PropertyIdArray *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                     (this,(size_t)((type_info *)(ulong)(size * 4) + 8));
  if (pPVar5 == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_009a869d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pPVar5->count = size;
  pPVar5->extraSlots = '\0';
  pPVar5->hadDuplicates = false;
  pPVar5->has__proto__ = false;
  pPVar5->hasNonSimpleParams = false;
  return pPVar5;
}

Assistant:

Js::PropertyIdArray * InterpreterStackFrame::OP_NewPropIdArrForCompProps(uint32 size, ScriptContext* scriptContext)
    {
        uint extraAlloc = UInt32Math::Mul(size, sizeof(Js::PropertyId));
        Js::PropertyIdArray * propIdArr = RecyclerNewPlusLeaf(scriptContext->GetRecycler(), extraAlloc, Js::PropertyIdArray, size, 0);
        return propIdArr;
    }